

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

char * dedotdotify(char *input,size_t clen)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  byte *__s;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  char *__dest;
  
  pcVar5 = (char *)(*Curl_cmalloc)(clen + 1);
  if (pcVar5 == (char *)0x0) {
    return (char *)0x0;
  }
  *pcVar5 = '\0';
  bVar2 = *input;
  if (bVar2 == 0) {
    return pcVar5;
  }
  __s = (byte *)strchr(input,0x3f);
  __dest = pcVar5;
  do {
    uVar8 = (ulong)bVar2;
    if (bVar2 == 0x2f) {
      if (((byte *)input)[1] - 0x2e == 0) {
        iVar3 = 0x2f - (uint)((byte *)input)[2];
      }
      else {
        iVar3 = -(((byte *)input)[1] - 0x2e);
      }
      if (iVar3 == 0) {
LAB_005b06c5:
        input = (char *)((byte *)input + 2);
      }
      else {
        uVar4 = ((byte *)input)[1] - 0x2e;
        if (uVar4 == 0) {
          uVar4 = (uint)((byte *)input)[2];
        }
        if (uVar4 == 0) goto LAB_005b07ff;
        if (((byte *)input)[1] - 0x2e == 0) {
          iVar3 = 0x3f - (uint)((byte *)input)[2];
        }
        else {
          iVar3 = -(((byte *)input)[1] - 0x2e);
        }
        if (iVar3 == 0) goto LAB_005b07ff;
        iVar3 = strncmp("/../",input,4);
        if (iVar3 != 0) {
          iVar3 = strcmp("/..",input);
          if ((iVar3 != 0) && (iVar3 = strncmp("/..?",input,4), iVar3 != 0)) goto LAB_005b07a0;
          goto LAB_005b07f7;
        }
        input = (char *)((byte *)input + 3);
        pcVar6 = __dest;
        do {
          __dest = pcVar6;
          if (pcVar6 <= pcVar5) break;
          __dest = pcVar6 + -1;
          pcVar1 = pcVar6 + -1;
          pcVar6 = __dest;
        } while (*pcVar1 != '/');
        *__dest = '\0';
      }
    }
    else {
      if (bVar2 == 0x2e) {
        if (((byte *)input)[1] == 0x2f) goto LAB_005b06c5;
        if (((byte *)input)[1] - 0x2e == 0) {
          iVar3 = 0x2f - (uint)((byte *)input)[2];
        }
        else {
          iVar3 = -(((byte *)input)[1] - 0x2e);
        }
        if (iVar3 == 0) {
          input = (char *)((byte *)input + 3);
          goto LAB_005b07bf;
        }
        pcVar6 = pcVar5;
        if (((byte *)input)[1] == 0) goto LAB_005b080d;
        uVar4 = ((byte *)input)[1] - 0x2e;
        if (uVar4 == 0) {
          uVar4 = (uint)((byte *)input)[2];
        }
        if ((uVar4 == 0) || (((byte *)input)[1] == 0x3f)) goto LAB_005b080d;
        if (((byte *)input)[1] - 0x2e == 0) {
          iVar3 = 0x3f - (uint)((byte *)input)[2];
        }
        else {
          iVar3 = -(((byte *)input)[1] - 0x2e);
        }
        if (iVar3 == 0) goto LAB_005b080d;
      }
LAB_005b07a0:
      do {
        do {
          *__dest = (char)uVar8;
          __dest = __dest + 1;
          uVar8 = (ulong)((byte *)input)[1];
          input = (char *)((byte *)input + 1);
        } while (0x3f < uVar8);
      } while ((0x8000800000000001U >> (uVar8 & 0x3f) & 1) == 0);
      *__dest = '\0';
    }
LAB_005b07bf:
    bVar2 = *input;
    if (bVar2 == 0) goto LAB_005b0810;
  } while (input < __s || __s == (byte *)0x0);
  goto LAB_005b0815;
  while (pcVar6 = __dest + -1, pcVar1 = __dest + -1, __dest = pcVar6, *pcVar1 != '/') {
LAB_005b07f7:
    if (__dest <= pcVar5) break;
  }
LAB_005b07ff:
  *__dest = '/';
  __dest = __dest + 1;
  pcVar6 = __dest;
LAB_005b080d:
  *pcVar6 = '\0';
LAB_005b0810:
  if (__s == (byte *)0x0) {
    return pcVar5;
  }
LAB_005b0815:
  sVar7 = strlen((char *)__s);
  memcpy(__dest,__s,sVar7 + 1);
  return pcVar5;
}

Assistant:

UNITTEST char *dedotdotify(const char *input, size_t clen)
{
  char *out = malloc(clen + 1);
  char *outptr;
  const char *orginput = input;
  char *queryp;
  if(!out)
    return NULL; /* out of memory */

  *out = 0; /* null-terminates, for inputs like "./" */
  outptr = out;

  if(!*input)
    /* zero length input string, return that */
    return out;

  /*
   * To handle query-parts properly, we must find it and remove it during the
   * dotdot-operation and then append it again at the end to the output
   * string.
   */
  queryp = strchr(input, '?');

  do {
    bool dotdot = TRUE;
    if(*input == '.') {
      /*  A.  If the input buffer begins with a prefix of "../" or "./", then
          remove that prefix from the input buffer; otherwise, */

      if(!strncmp("./", input, 2)) {
        input += 2;
        clen -= 2;
      }
      else if(!strncmp("../", input, 3)) {
        input += 3;
        clen -= 3;
      }
      /*  D.  if the input buffer consists only of "." or "..", then remove
          that from the input buffer; otherwise, */

      else if(!strcmp(".", input) || !strcmp("..", input) ||
              !strncmp(".?", input, 2) || !strncmp("..?", input, 3)) {
        *out = 0;
        break;
      }
      else
        dotdot = FALSE;
    }
    else if(*input == '/') {
      /*  B.  if the input buffer begins with a prefix of "/./" or "/.", where
          "."  is a complete path segment, then replace that prefix with "/" in
          the input buffer; otherwise, */
      if(!strncmp("/./", input, 3)) {
        input += 2;
        clen -= 2;
      }
      else if(!strcmp("/.", input) || !strncmp("/.?", input, 3)) {
        *outptr++ = '/';
        *outptr = 0;
        break;
      }

      /*  C.  if the input buffer begins with a prefix of "/../" or "/..",
          where ".." is a complete path segment, then replace that prefix with
          "/" in the input buffer and remove the last segment and its
          preceding "/" (if any) from the output buffer; otherwise, */

      else if(!strncmp("/../", input, 4)) {
        input += 3;
        clen -= 3;
        /* remove the last segment from the output buffer */
        while(outptr > out) {
          outptr--;
          if(*outptr == '/')
            break;
        }
        *outptr = 0; /* null-terminate where it stops */
      }
      else if(!strcmp("/..", input) || !strncmp("/..?", input, 4)) {
        /* remove the last segment from the output buffer */
        while(outptr > out) {
          outptr--;
          if(*outptr == '/')
            break;
        }
        *outptr++ = '/';
        *outptr = 0; /* null-terminate where it stops */
        break;
      }
      else
        dotdot = FALSE;
    }
    else
      dotdot = FALSE;

    if(!dotdot) {
      /*  E.  move the first path segment in the input buffer to the end of
          the output buffer, including the initial "/" character (if any) and
          any subsequent characters up to, but not including, the next "/"
          character or the end of the input buffer. */

      do {
        *outptr++ = *input++;
        clen--;
      } while(*input && (*input != '/') && (*input != '?'));
      *outptr = 0;
    }

    /* continue until end of input string OR, if there is a terminating
       query part, stop there */
  } while(*input && (!queryp || (input < queryp)));

  if(queryp) {
    size_t qlen;
    /* There was a query part, append that to the output. */
    size_t oindex = queryp - orginput;
    qlen = strlen(&orginput[oindex]);
    memcpy(outptr, &orginput[oindex], qlen + 1); /* include zero byte */
  }

  return out;
}